

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_scratch_tests(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  secp256k1_context *psVar2;
  secp256k1_scratch_space *psVar3;
  size_t sVar4;
  void *pvVar5;
  secp256k1_callback _saved_callback_4;
  int32_t _calls_to_callback_4;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  secp256k1_scratch_space local_scratch;
  secp256k1_scratch_space *scratch;
  size_t checkpoint_2;
  size_t checkpoint;
  size_t adj_alloc;
  secp256k1_scratch *in_stack_ffffffffffffff48;
  secp256k1_context *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  secp256k1_scratch *in_stack_ffffffffffffff60;
  secp256k1_callback *in_stack_ffffffffffffff68;
  
  psVar3 = secp256k1_scratch_space_create
                     (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  if (psVar3 == (secp256k1_scratch_space *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x173,"test condition failed: scratch != NULL");
    abort();
  }
  sVar4 = secp256k1_scratch_max_allocation
                    ((secp256k1_callback *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_scratch *)in_stack_ffffffffffffff50,
                     (size_t)in_stack_ffffffffffffff48);
  if (sVar4 != 1000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x176,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000"
           );
    abort();
  }
  sVar4 = secp256k1_scratch_max_allocation
                    ((secp256k1_callback *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_scratch *)in_stack_ffffffffffffff50,
                     (size_t)in_stack_ffffffffffffff48);
  if (sVar4 != 0x3d9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x177,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - (ALIGNMENT - 1)"
           );
    abort();
  }
  if (psVar3->alloc_size != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x178,"test condition failed: scratch->alloc_size == 0");
    abort();
  }
  if ((psVar3->alloc_size & 0xf) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x179,"test condition failed: scratch->alloc_size % ALIGNMENT == 0");
    abort();
  }
  secp256k1_scratch_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffff48,(secp256k1_scratch *)0x110172);
  pvVar5 = secp256k1_scratch_alloc
                     (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (pvVar5 == (void *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17d,
            "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL"
           );
    abort();
  }
  sVar4 = secp256k1_scratch_max_allocation
                    ((secp256k1_callback *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_scratch *)in_stack_ffffffffffffff50,
                     (size_t)in_stack_ffffffffffffff48);
  if (sVar4 != 0x1e8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17e,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc"
           );
    abort();
  }
  sVar4 = secp256k1_scratch_max_allocation
                    ((secp256k1_callback *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_scratch *)in_stack_ffffffffffffff50,
                     (size_t)in_stack_ffffffffffffff48);
  if (sVar4 != 0x1d9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17f,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1)"
           );
    abort();
  }
  if (psVar3->alloc_size == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x180,"test condition failed: scratch->alloc_size != 0");
    abort();
  }
  if ((psVar3->alloc_size & 0xf) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x181,"test condition failed: scratch->alloc_size % ALIGNMENT == 0");
    abort();
  }
  pvVar5 = secp256k1_scratch_alloc
                     (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (pvVar5 != (void *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x184,
            "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 501) == NULL"
           );
    abort();
  }
  sVar4 = secp256k1_scratch_max_allocation
                    ((secp256k1_callback *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_scratch *)in_stack_ffffffffffffff50,
                     (size_t)in_stack_ffffffffffffff48);
  if (sVar4 != 0x1e8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x185,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc"
           );
    abort();
  }
  sVar4 = secp256k1_scratch_max_allocation
                    ((secp256k1_callback *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_scratch *)in_stack_ffffffffffffff50,
                     (size_t)in_stack_ffffffffffffff48);
  if (sVar4 != 0x1d9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x186,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1)"
           );
    abort();
  }
  if (psVar3->alloc_size == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x187,"test condition failed: scratch->alloc_size != 0");
    abort();
  }
  if ((psVar3->alloc_size & 0xf) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x188,"test condition failed: scratch->alloc_size % ALIGNMENT == 0");
    abort();
  }
  secp256k1_scratch_apply_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x11058b);
  if (psVar3->alloc_size == 0) {
    sVar4 = secp256k1_scratch_max_allocation
                      ((secp256k1_callback *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (secp256k1_scratch *)in_stack_ffffffffffffff50,
                       (size_t)in_stack_ffffffffffffff48);
    if (sVar4 != 1000) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x18d,
              "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000"
             );
      abort();
    }
    pvVar5 = secp256k1_scratch_alloc
                       (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (pvVar5 != (void *)0x0) {
      if (psVar3->alloc_size != 0) {
        secp256k1_scratch_checkpoint
                  ((secp256k1_callback *)in_stack_ffffffffffffff48,(secp256k1_scratch *)0x110727);
        secp256k1_scratch_apply_checkpoint
                  ((secp256k1_callback *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   0x110752);
        p_Var1 = (CTX->error_callback).fn;
        pvVar5 = (CTX->error_callback).data;
        secp256k1_context_set_error_callback
                  (in_stack_ffffffffffffff50,
                   (_func_void_char_ptr_void_ptr *)in_stack_ffffffffffffff48,(void *)0x110791);
        secp256k1_scratch_apply_checkpoint
                  ((secp256k1_callback *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   0x1107b4);
        psVar2 = CTX;
        (CTX->error_callback).fn = p_Var1;
        (psVar2->error_callback).data = pvVar5;
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x194,"test condition failed: _calls_to_callback == 1");
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,399,"test condition failed: scratch->alloc_size != 0");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x18e,
            "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x18c,"test condition failed: scratch->alloc_size == 0");
  abort();
}

Assistant:

static void run_scratch_tests(void) {
    const size_t adj_alloc = ((500 + ALIGNMENT - 1) / ALIGNMENT) * ALIGNMENT;

    size_t checkpoint;
    size_t checkpoint_2;
    secp256k1_scratch_space *scratch;
    secp256k1_scratch_space local_scratch;

    /* Test public API */
    scratch = secp256k1_scratch_space_create(CTX, 1000);
    CHECK(scratch != NULL);

    /* Test internal API */
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - (ALIGNMENT - 1));
    CHECK(scratch->alloc_size == 0);
    CHECK(scratch->alloc_size % ALIGNMENT == 0);

    /* Allocating 500 bytes succeeds */
    checkpoint = secp256k1_scratch_checkpoint(&CTX->error_callback, scratch);
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1));
    CHECK(scratch->alloc_size != 0);
    CHECK(scratch->alloc_size % ALIGNMENT == 0);

    /* Allocating another 501 bytes fails */
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 501) == NULL);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1));
    CHECK(scratch->alloc_size != 0);
    CHECK(scratch->alloc_size % ALIGNMENT == 0);

    /* ...but it succeeds once we apply the checkpoint to undo it */
    secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint);
    CHECK(scratch->alloc_size == 0);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000);
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL);
    CHECK(scratch->alloc_size != 0);

    /* try to apply a bad checkpoint */
    checkpoint_2 = secp256k1_scratch_checkpoint(&CTX->error_callback, scratch);
    secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint);
    CHECK_ERROR_VOID(CTX, secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint_2)); /* checkpoint_2 is after checkpoint */
    CHECK_ERROR_VOID(CTX, secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, (size_t) -1)); /* this is just wildly invalid */

    /* try to use badly initialized scratch space */
    secp256k1_scratch_space_destroy(CTX, scratch);
    memset(&local_scratch, 0, sizeof(local_scratch));
    scratch = &local_scratch;
    CHECK_ERROR(CTX, secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0));
    CHECK_ERROR(CTX, secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500));
    CHECK_ERROR_VOID(CTX, secp256k1_scratch_space_destroy(CTX, scratch));

    /* Test that large integers do not wrap around in a bad way */
    scratch = secp256k1_scratch_space_create(CTX, 1000);
    /* Try max allocation with a large number of objects. Only makes sense if
     * ALIGNMENT is greater than 1 because otherwise the objects take no extra
     * space. */
    CHECK(ALIGNMENT <= 1 || !secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, (SIZE_MAX / (ALIGNMENT - 1)) + 1));
    /* Try allocating SIZE_MAX to test wrap around which only happens if
     * ALIGNMENT > 1, otherwise it returns NULL anyway because the scratch
     * space is too small. */
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, SIZE_MAX) == NULL);
    secp256k1_scratch_space_destroy(CTX, scratch);

    /* cleanup */
    secp256k1_scratch_space_destroy(CTX, NULL); /* no-op */
}